

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O1

void __thiscall
DynamicGraph::updateVisitedComponents
          (DynamicGraph *this,list<unsigned_long,_std::allocator<unsigned_long>_> *visited)

{
  pointer puVar1;
  _List_node_base *p_Var2;
  
  this->nextComponent = this->nextComponent + 1;
  p_Var2 = (visited->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)visited) {
    puVar1 = (this->components).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      puVar1[(long)p_Var2[1]._M_next] = this->nextComponent;
      p_Var2 = (((_List_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var2->_M_next)->
               _M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var2 != (_List_node_base *)visited);
  }
  return;
}

Assistant:

void DynamicGraph::updateVisitedComponents(const std::list<Vertex>& visited)
{
    this->nextComponent++;
    for (unsigned long v : visited) {
        this->components[v] = this->nextComponent;
    }
}